

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

void __thiscall
picojson::
serialize_str_char<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator()(serialize_str_char<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,char c)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  undefined7 in_register_00000031;
  long lVar3;
  ulong uVar4;
  char buf [7];
  long *local_40;
  long local_38;
  long local_30 [2];
  
  iVar2 = (int)CONCAT71(in_register_00000031,c);
  if (iVar2 < 0x22) {
    switch(iVar2) {
    case 8:
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\\b","");
      if (0 < local_38) {
        pbVar1 = (this->oi).container;
        uVar4 = local_38 + 1;
        do {
          std::__cxx11::string::push_back((char)pbVar1);
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
      break;
    case 9:
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\\t","");
      if (0 < local_38) {
        pbVar1 = (this->oi).container;
        uVar4 = local_38 + 1;
        do {
          std::__cxx11::string::push_back((char)pbVar1);
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
      break;
    case 10:
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\\n","");
      if (0 < local_38) {
        pbVar1 = (this->oi).container;
        uVar4 = local_38 + 1;
        do {
          std::__cxx11::string::push_back((char)pbVar1);
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
      break;
    default:
switchD_0010d957_caseD_b:
      if ((byte)c < 0x20 || c == '\x7f') {
        lVar3 = 0;
        snprintf((char *)&local_40,7,"\\u%04x",(ulong)(byte)c);
        pbVar1 = (this->oi).container;
        do {
          std::__cxx11::string::push_back((char)pbVar1);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 6);
        return;
      }
      std::__cxx11::string::push_back((char)(this->oi).container);
      return;
    case 0xc:
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\\f","");
      if (0 < local_38) {
        pbVar1 = (this->oi).container;
        uVar4 = local_38 + 1;
        do {
          std::__cxx11::string::push_back((char)pbVar1);
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
      break;
    case 0xd:
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\\r","");
      if (0 < local_38) {
        pbVar1 = (this->oi).container;
        uVar4 = local_38 + 1;
        do {
          std::__cxx11::string::push_back((char)pbVar1);
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
    }
  }
  else if (iVar2 == 0x5c) {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\\\\","");
    if (0 < local_38) {
      pbVar1 = (this->oi).container;
      uVar4 = local_38 + 1;
      do {
        std::__cxx11::string::push_back((char)pbVar1);
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
  }
  else if (iVar2 == 0x2f) {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\\/","");
    if (0 < local_38) {
      pbVar1 = (this->oi).container;
      uVar4 = local_38 + 1;
      do {
        std::__cxx11::string::push_back((char)pbVar1);
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
  }
  else {
    if (iVar2 != 0x22) goto switchD_0010d957_caseD_b;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\\\"","");
    if (0 < local_38) {
      pbVar1 = (this->oi).container;
      uVar4 = local_38 + 1;
      do {
        std::__cxx11::string::push_back((char)pbVar1);
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void operator()(char c) {
    switch (c) {
#define MAP(val, sym)                                                                                                              \
  case val:                                                                                                                        \
    copy(sym, oi);                                                                                                                 \
    break
      MAP('"', "\\\"");
      MAP('\\', "\\\\");
      MAP('/', "\\/");
      MAP('\b', "\\b");
      MAP('\f', "\\f");
      MAP('\n', "\\n");
      MAP('\r', "\\r");
      MAP('\t', "\\t");
#undef MAP
    default:
      if (static_cast<unsigned char>(c) < 0x20 || c == 0x7f) {
        char buf[7];
        SNPRINTF(buf, sizeof(buf), "\\u%04x", c & 0xff);
        copy(buf, buf + 6, oi);
      } else {
        *oi++ = c;
      }
      break;
    }
  }